

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3e8f::test_flip_inplace(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *prVar2;
  roaring64_bitmap_t *prVar3;
  uint64_t roaring64_bitmap_from_array [4];
  uint64_t auStack_50 [5];
  
  prVar2 = roaring64_bitmap_create();
  roaring64_bitmap_flip_inplace(prVar2,10,100000);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_contains_range(prVar2,10,100000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_range(r1, 10, 100000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5b6);
  roaring64_bitmap_free(prVar2);
  auStack_50[1] = 3;
  auStack_50[2] = 6;
  auStack_50[0] = 1;
  prVar2 = roaring64_bitmap_of_ptr(3,auStack_50);
  roaring64_bitmap_flip_inplace(prVar2,2,5);
  auStack_50[0] = 1;
  auStack_50[1] = 2;
  auStack_50[2] = 4;
  auStack_50[3] = 6;
  prVar3 = roaring64_bitmap_of_ptr(4,auStack_50);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_equals(prVar2,prVar3);
  _assert_true((ulong)_Var1,"roaring64_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5c0);
  roaring64_bitmap_free(prVar2);
  roaring64_bitmap_free(prVar3);
  auStack_50[1] = 3;
  auStack_50[2] = 6;
  auStack_50[0] = 1;
  prVar2 = roaring64_bitmap_of_ptr(3,auStack_50);
  roaring64_bitmap_flip_inplace(prVar2,3,3);
  auStack_50[1] = 3;
  auStack_50[2] = 6;
  auStack_50[0] = 1;
  prVar3 = roaring64_bitmap_of_ptr(3,auStack_50);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_equals(prVar2,prVar3);
  _assert_true((ulong)_Var1,"roaring64_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5cb);
  roaring64_bitmap_free(prVar2);
  roaring64_bitmap_free(prVar3);
  auStack_50[1] = 0x30001;
  auStack_50[2] = 0x40003;
  auStack_50[0] = 0x20000;
  prVar2 = roaring64_bitmap_of_ptr(3,auStack_50);
  roaring64_bitmap_flip_inplace(prVar2,0x20000,0x40004);
  prVar3 = roaring64_bitmap_from_range(0x20001,0x40003,1);
  roaring64_bitmap_remove(prVar3,0x30001);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_equals(prVar2,prVar3);
  _assert_true((ulong)_Var1,"roaring64_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5d9);
  roaring64_bitmap_free(prVar2);
  roaring64_bitmap_free(prVar3);
  return;
}

Assistant:

DEFINE_TEST(test_flip_inplace) {
    {
        // Flipping an empty bitmap should result in a non-empty range.
        roaring64_bitmap_t* r1 = roaring64_bitmap_create();
        roaring64_bitmap_flip_inplace(r1, 10, 100000);
        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_contains_range(r1, 10, 100000));

        roaring64_bitmap_free(r1);
    }
    {
        // Only the specified range should be flipped.
        roaring64_bitmap_t* r1 = roaring64_bitmap_from(1, 3, 6);
        roaring64_bitmap_flip_inplace(r1, 2, 5);
        roaring64_bitmap_t* r2 = roaring64_bitmap_from(1, 2, 4, 6);
        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_equals(r1, r2));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
    {
        // An empty range does nothing.
        roaring64_bitmap_t* r1 = roaring64_bitmap_from(1, 3, 6);
        roaring64_bitmap_flip_inplace(r1, 3, 3);
        roaring64_bitmap_t* r2 = roaring64_bitmap_from(1, 3, 6);
        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_equals(r1, r2));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
    {
        // A bitmap with values in all affected containers.
        roaring64_bitmap_t* r1 =
            roaring64_bitmap_from((2 << 16), (3 << 16) + 1, (4 << 16) + 3);
        roaring64_bitmap_flip_inplace(r1, (2 << 16), (4 << 16) + 4);
        roaring64_bitmap_t* r2 =
            roaring64_bitmap_from_range((2 << 16) + 1, (4 << 16) + 3, 1);
        roaring64_bitmap_remove(r2, (3 << 16) + 1);
        assert_r64_valid(r1);
        assert_true(roaring64_bitmap_equals(r1, r2));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
}